

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_matrix.cpp
# Opt level: O0

Reals __thiscall Omega_h::repeat_matrix<1>(Omega_h *this,LO n,Tensor<1> m)

{
  Reals RVar1;
  LO n_local;
  Tensor<1> m_local;
  int local_60;
  int local_5c;
  Int j;
  Int i;
  Vector<1> local_50;
  Vector<1> v;
  
  for (local_5c = 0; local_5c < 1; local_5c = local_5c + 1) {
    for (local_60 = 0; local_60 < 1; local_60 = local_60 + 1) {
      v.super_Few<double,_1>.array_[0]._4_4_ = local_5c + local_60;
      (&v)[(long)v.super_Few<double,_1>.array_[0]._4_4_ + -1].super_Few<double,_1>.array_[0] =
           *(double *)(&j + (long)local_60 * 2 + (long)local_5c * 2);
    }
  }
  _j = (Vector<1>  [1])
       (Vector<1>  [1])m.super_Few<Omega_h::Vector<1>,_1>.array_[0].super_Few<double,_1>.array_[0];
  RVar1 = repeat_vector<1>(this,n,local_50);
  RVar1.write_.shared_alloc_.alloc = (Alloc *)this;
  return (Reals)RVar1.write_.shared_alloc_;
}

Assistant:

Reals repeat_matrix(LO const n, Tensor<dim> const m) {
  return repeat_vector(n, matrix2vector(m));
}